

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

int bitset_container_rank(bitset_container_t *container,uint16_t x)

{
  ulong uVar1;
  undefined6 in_register_00000032;
  int iVar2;
  ulong uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = CONCAT62(in_register_00000032,x) & 0xffffffff;
  if ((ushort)uVar6 < 0x40) {
    puVar4 = container->words;
    uVar3 = 0;
    iVar2 = 0;
  }
  else {
    uVar3 = CONCAT62(in_register_00000032,x) >> 6 & 0x3ffffff;
    puVar4 = container->words;
    uVar5 = 0;
    iVar2 = 0;
    do {
      uVar1 = puVar4[uVar5] - (puVar4[uVar5] >> 1 & 0x5555555555555555);
      uVar1 = (uVar1 >> 2 & 0x3333333333333333) + (uVar1 & 0x3333333333333333);
      iVar2 = iVar2 + (uint)(byte)(((uVar1 >> 4) + uVar1 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                  0x38);
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  uVar6 = (2L << ((byte)uVar6 & 0x3f)) - 1U & puVar4[uVar3];
  uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
  uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
  return (uint)(byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
         iVar2;
}

Assistant:

int bitset_container_rank(const bitset_container_t *container, uint16_t x) {
  // credit: aqrit
  int sum = 0;
  int i = 0;
  for (int end = x / 64; i < end; i++){
    sum += roaring_hamming(container->words[i]);
  }
  uint64_t lastword = container->words[i];
  uint64_t lastpos = UINT64_C(1) << (x % 64);
  uint64_t mask = lastpos + lastpos - 1; // smear right
  sum += roaring_hamming(lastword & mask);
  return sum;
}